

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::ExpressionBinder::TryBindLambdaOrJson
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *function,
          idx_t depth,CatalogEntry *func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  BindResult json_bind_result;
  BindResult lambda_bind_result;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_140;
  undefined2 local_138;
  uint *local_130;
  size_type local_128;
  uint local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  uint *local_110;
  size_type local_108;
  uint local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0 [56];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b8;
  undefined2 local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  uint *local_88;
  size_type local_80;
  uint local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  (*this->_vptr_ExpressionBinder[9])(&local_b8,this,function,func,depth);
  if ((char)local_b0 == '\0') {
    (__return_storage_ptr__->expression).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false> =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)local_b8._M_head_impl;
    local_b8._M_head_impl = (Expression *)0x0;
    (__return_storage_ptr__->error).initialized = (bool)(char)local_b0;
    (__return_storage_ptr__->error).type = local_b0._1_1_;
    paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
    (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      *(undefined4 *)paVar1 = local_a8.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
           local_a8.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
           local_a8.field_2._8_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
           local_a8.field_2._12_4_;
    }
    else {
      (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = local_a8._M_dataplus._M_p;
      (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
           CONCAT44(local_a8.field_2._M_allocated_capacity._4_4_,
                    local_a8.field_2._M_allocated_capacity._0_4_);
    }
    (__return_storage_ptr__->error).raw_message._M_string_length = local_a8._M_string_length;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity._0_4_ =
         local_a8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
    (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
    if (local_88 == &local_78) {
      *(uint *)paVar1 = local_78;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) = uStack_74;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) = uStack_70;
      *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
           uStack_6c;
    }
    else {
      (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_88;
      (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
           CONCAT44(uStack_74,local_78);
    }
    (__return_storage_ptr__->error).final_message._M_string_length = local_80;
    local_80 = 0;
    local_78 = local_78 & 0xffffff00;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_88 = &local_78;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(__return_storage_ptr__->error).extra_info,local_68);
  }
  else {
    (*this->_vptr_ExpressionBinder[8])(&local_140,this,function,func,depth);
    if ((char)local_138 == '\0') {
      (__return_storage_ptr__->expression).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)local_140._M_head_impl;
      local_140._M_head_impl = (Expression *)0x0;
      (__return_storage_ptr__->error).initialized = (bool)(char)local_138;
      (__return_storage_ptr__->error).type = local_138._1_1_;
      paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
      (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
      if (local_130 == &local_120) {
        *(uint *)paVar1 = local_120;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) = uStack_11c
        ;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) = uStack_118
        ;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
             uStack_114;
      }
      else {
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_130;
        (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
             CONCAT44(uStack_11c,local_120);
      }
      (__return_storage_ptr__->error).raw_message._M_string_length = local_128;
      local_128 = 0;
      local_120 = local_120 & 0xffffff00;
      paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
      (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
      if (local_110 == &local_100) {
        *(uint *)paVar1 = local_100;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
             uStack_fc;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
             uStack_f8;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
             uStack_f4;
      }
      else {
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_110;
        (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
             CONCAT44(uStack_fc,local_100);
      }
      (__return_storage_ptr__->error).final_message._M_string_length = local_108;
      local_108 = 0;
      local_100 = local_100 & 0xffffff00;
      local_130 = &local_120;
      local_110 = &local_100;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(__return_storage_ptr__->error).extra_info,local_f0);
    }
    else {
      ::std::operator+(&local_160,"failed to bind function, either: ",&local_a8);
      plVar2 = (long *)::std::__cxx11::string::append((char *)&local_160);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_190 = *plVar3;
        lStack_188 = plVar2[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *plVar3;
        local_1a0 = (long *)*plVar2;
      }
      local_198 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)::std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_130);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_180.field_2._M_allocated_capacity = *psVar4;
        local_180.field_2._8_8_ = plVar2[3];
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *psVar4;
        local_180._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_180._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      BindResult::BindResult(__return_storage_ptr__,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_f0);
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_140._M_head_impl != (Expression *)0x0) {
      (*((local_140._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_68);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_b8._M_head_impl != (Expression *)0x0) {
    (*((local_b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::TryBindLambdaOrJson(FunctionExpression &function, idx_t depth, CatalogEntry &func) {

	auto lambda_bind_result = BindLambdaFunction(function, func.Cast<ScalarFunctionCatalogEntry>(), depth);
	if (!lambda_bind_result.HasError()) {
		return lambda_bind_result;
	}

	auto json_bind_result = BindFunction(function, func.Cast<ScalarFunctionCatalogEntry>(), depth);
	if (!json_bind_result.HasError()) {
		return json_bind_result;
	}

	return BindResult("failed to bind function, either: " + lambda_bind_result.error.RawMessage() +
	                  "\n"
	                  " or: " +
	                  json_bind_result.error.RawMessage());
}